

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall wasm::WATParser::Lexer::skipSpace(Lexer *this)

{
  bool *this_00;
  pointer *ppAVar1;
  iterator __position;
  undefined8 uVar2;
  undefined1 uVar3;
  size_t sVar4;
  char *pcVar5;
  void *pvVar6;
  char *in_RCX;
  undefined8 unaff_RBX;
  long lVar7;
  undefined1 *puVar8;
  bool bVar9;
  size_type __n;
  undefined8 unaff_R14;
  string_view sv;
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view s;
  string_view sVar10;
  string_view in_04;
  string_view in_05;
  string_view in_06;
  undefined1 local_f8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  undefined1 local_d8 [8];
  undefined1 local_d0 [24];
  bool local_b8;
  char *local_b0;
  optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult> ctx;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> ctx_1;
  char *local_58;
  IString *pIStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  do {
    join_0x00000010_0x00000000_ = next(this);
    this_00 = &ctx.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
               ._M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
               ._M_engaged;
    local_48 = (char *)0x0;
    pcStack_40 = (char *)0x0;
    local_58 = (char *)0x0;
    pIStack_50 = (IString *)0x0;
    ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _M_payload._M_value.span._M_str = (char *)0x0;
    ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _M_engaged = false;
    ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _17_7_ = 0;
    local_38 = (char *)0x0;
    sVar10._M_str = ";;@";
    sVar10._M_len = 3;
    sVar4 = anon_unknown_0::LexCtx::startsWith((LexCtx *)this_00,sVar10);
    if (sVar4 == 0) {
      sv._M_str = "(@";
      sv._M_len = 2;
      sVar4 = anon_unknown_0::LexCtx::startsWith((LexCtx *)this_00,sv);
      if (sVar4 == 0) goto LAB_00b8f852;
      ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str = (char *)0x2;
      ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _16_8_ = ctx.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
               ._M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
               ._48_8_ + -2;
      pcVar5 = (char *)ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                       ._48_8_;
      uVar3 = ctx.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
              ._M_payload._40_1_;
      if ((ulong)ctx.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                 ._48_8_ < 2) {
LAB_00b8f98e:
        ctx.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
        _M_payload._40_1_ = uVar3;
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   ctx_1.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _M_payload._M_value.span._M_str,pcVar5);
      }
      local_58 = (char *)(ctx_1.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                          ._M_payload._M_value.span._M_len + 2);
      unaff_RBX = (char *)0x0;
      do {
        pcVar5 = (char *)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_;
        uVar3 = ctx.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                ._M_payload._40_1_;
        if ((ulong)ctx.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                   ._48_8_ <
            ctx_1.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
        in_04._M_len = ctx_1.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str +
                       ctx_1.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_len;
        in_04._M_str = (char *)ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                               ._48_8_;
        in_RCX = (char *)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_;
        anon_unknown_0::idchar
                  ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_f8,
                   (anon_unknown_0 *)
                   (ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                    ._48_8_ -
                   ctx_1.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _M_payload._8_8_),in_04);
        uVar3 = ctx.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                ._M_payload._40_1_;
        if (lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._8_1_ == '\x01') {
          pIStack_50 = (IString *)((long)&(pIStack_50->str)._M_len + 1);
          ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._M_value.span._M_str =
               ctx_1.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _M_payload._M_value.span._M_str + 1;
          unaff_RBX = (char *)0x1;
        }
      } while (lexed.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _M_payload._8_1_ != '\0');
      if ((char *)unaff_RBX != (char *)0x0) {
        pcVar5 = (char *)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_;
        if ((ulong)ctx.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                   ._48_8_ <
            ctx_1.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
        pcStack_40 = ctx_1.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_str +
                     ctx_1.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_len;
        local_48 = (char *)(ctx.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                            ._48_8_ -
                           ctx_1.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._8_8_);
        in_RCX = (char *)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_;
        if (local_48 != (char *)0x0) {
          unaff_R14 = (char *)0x1;
          unaff_RBX = ZEXT18((byte)ctx.
                                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                   ._M_payload._40_1_);
          do {
            in._M_len = ctx.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                        ._48_8_ - ctx_1.
                                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                  ._M_payload._8_8_;
            pcVar5 = (char *)ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                             ._48_8_;
            if ((ulong)ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                       ._48_8_ <
                ctx_1.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
            in._M_str = ctx_1.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                        ._M_payload._M_value.span._M_str +
                        ctx_1.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                        ._M_payload._M_value.span._M_len;
            anon_unknown_0::space
                      ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_f8,in);
            if (lexed.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._8_1_ == '\x01') {
LAB_00b8f647:
              local_38 = local_38 + (long)local_f8;
              ctx_1.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._M_value.span._M_str =
                   ctx_1.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _M_payload._M_value.span._M_str + (long)local_f8;
            }
            else {
              in_00._M_len = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                             ._48_8_ - ctx_1.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                       ._M_payload._8_8_;
              pcVar5 = (char *)ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                               ._48_8_;
              if ((ulong)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_ <
                  ctx_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
              in_00._M_str = ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::keyword
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_f8,
                         in_00);
              if (lexed.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._8_1_ == '\x01') goto LAB_00b8f647;
              in_01._M_len = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                             ._48_8_ - ctx_1.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                       ._M_payload._8_8_;
              pcVar5 = (char *)ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                               ._48_8_;
              if ((ulong)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_ <
                  ctx_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
              in_01._M_str = ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::integer
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_f8,
                         in_01);
              if (local_d8[0] == '\x01') goto LAB_00b8f647;
              in_02._M_len = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                             ._48_8_ - ctx_1.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                       ._M_payload._8_8_;
              pcVar5 = (char *)ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                               ._48_8_;
              if ((ulong)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_ <
                  ctx_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
              in_02._M_str = ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::float_
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)
                         local_f8,in_02);
              if (local_d0[0] == '\x01') goto LAB_00b8f647;
              in_03._M_len = ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                             ._48_8_ - ctx_1.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                       ._M_payload._8_8_;
              pcVar5 = (char *)ctx.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                               ._48_8_;
              if ((ulong)ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._48_8_ <
                  ctx_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
              in_03._M_str = ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str +
                             ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_len;
              anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                                  local_f8,in_03);
              if ((bool)local_d0[0x10] == true) {
                local_38 = local_38 + (long)local_f8;
                ctx_1.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._M_value.span._M_str =
                     ctx_1.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._M_payload._M_value.span._M_str + (long)local_f8;
                local_d0[0x10] = false;
                if (local_d0[8] == '\x01') {
                  local_d0[8] = '\0';
                  if ((undefined1 *)
                      CONCAT71(lexed.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._9_7_,
                               lexed.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._8_1_) != local_d8) {
                    lVar7 = CONCAT71(local_d8._1_7_,local_d8[0]);
                    puVar8 = (undefined1 *)
                             CONCAT71(lexed.
                                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                      ._M_payload._9_7_,
                                      lexed.
                                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                      ._M_payload._8_1_);
LAB_00b8f748:
                    local_d0[0x10] = false;
                    operator_delete(puVar8,lVar7 + 1);
                  }
                }
              }
              else {
                pcVar5 = (char *)ctx.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                 ._48_8_;
                if ((ulong)ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                           ._48_8_ <
                    ctx_1.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str) goto LAB_00b8f98e;
                in_05._M_len = ctx_1.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._M_value.span._M_str +
                               ctx_1.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._M_payload._M_value.span._M_len;
                in_05._M_str = (char *)ctx.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                       ._48_8_;
                in_RCX = (char *)ctx.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                 ._48_8_;
                anon_unknown_0::ident
                          ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_f8
                           ,(anon_unknown_0 *)
                            (ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                             ._48_8_ -
                            ctx_1.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                            ._M_payload._8_8_),in_05);
                if (local_b8 == true) {
                  local_38 = local_38 + (long)local_f8;
                  ctx_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str =
                       ctx_1.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                       ._M_payload._M_value.span._M_str + (long)local_f8;
                  local_b8 = false;
                  if (((bool)local_d0[0x10] == true) &&
                     (local_d0[0x10] = false,
                     (undefined1 *)
                     lexed.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._16_8_ != local_d0)) {
                    lVar7 = CONCAT71(local_d0._1_7_,local_d0[0]);
                    puVar8 = (undefined1 *)
                             lexed.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._16_8_;
                    goto LAB_00b8f748;
                  }
                }
                else {
                  sv_00._M_str = "(@";
                  sv_00._M_len = 2;
                  sVar4 = anon_unknown_0::LexCtx::startsWith((LexCtx *)this_00,sv_00);
                  if (sVar4 == 0) {
                    sv_01._M_str = "(";
                    sv_01._M_len = 1;
                    sVar4 = anon_unknown_0::LexCtx::startsWith((LexCtx *)this_00,sv_01);
                    if (sVar4 == 0) {
                      sv_02._M_str = ")";
                      sv_02._M_len = 1;
                      sVar4 = anon_unknown_0::LexCtx::startsWith((LexCtx *)this_00,sv_02);
                      if (sVar4 == 0) break;
                      unaff_R14 = unaff_R14 + -1;
                      if ((char *)unaff_R14 == (char *)0x0) {
                        ctx.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                        ._M_payload._40_1_ = uVar3;
                        ctx_1.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                        ._M_payload._M_value.span._M_str =
                             ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str + 1;
                        goto LAB_00b8f852;
                      }
                      local_38 = local_38 + 1;
                      ctx_1.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._M_payload._M_value.span._M_str =
                           ctx_1.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._M_value.span._M_str + 1;
                    }
                    else {
                      local_38 = local_38 + 1;
                      ctx_1.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._M_payload._M_value.span._M_str =
                           ctx_1.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                           ._M_payload._M_value.span._M_str + 1;
                      unaff_R14 = unaff_R14 + 1;
                    }
                  }
                  else {
                    local_38 = local_38 + 2;
                    ctx_1.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_str =
                         ctx_1.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                         ._M_payload._M_value.span._M_str + 2;
                    bVar9 = false;
                    do {
                      pcVar5 = (char *)ctx.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                       ._48_8_;
                      if ((ulong)ctx.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                 ._48_8_ <
                          ctx_1.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                          ._M_payload._M_value.span._M_str) goto LAB_00b8f98e;
                      in_06._M_len = ctx_1.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                     ._M_payload._M_value.span._M_str +
                                     ctx_1.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                     ._M_payload._M_value.span._M_len;
                      in_06._M_str = (char *)ctx.
                                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                             ._48_8_;
                      in_RCX = (char *)ctx.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                       ._48_8_;
                      anon_unknown_0::idchar
                                ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                                 local_f8,(anon_unknown_0 *)
                                          (ctx.
                                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                                           ._48_8_ -
                                          ctx_1.
                                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                          ._M_payload.
                                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                          ._M_payload._8_8_),in_06);
                      if (lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                          ._M_payload._8_1_ == '\x01') {
                        local_38 = local_38 + 1;
                        ctx_1.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                        ._M_payload._M_value.span._M_str =
                             ctx_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._M_value.span._M_str + 1;
                        bVar9 = true;
                      }
                    } while (lexed.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._M_payload._8_1_ != '\0');
                    if (!bVar9) {
                      unaff_RBX = (char *)0x0;
                      ctx.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                      ._M_payload._40_1_ = 0;
                      goto LAB_00b8f8d0;
                    }
                    unaff_R14 = unaff_R14 + (ulong)bVar9;
                  }
                }
              }
            }
            in_RCX = (char *)ctx.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                             ._48_8_;
          } while ((char *)ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                           ._48_8_ !=
                   ctx_1.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _M_payload._M_value.span._M_str);
        }
      }
LAB_00b8f8cc:
      ctx.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
      _M_payload._40_1_ = 0;
    }
    else {
      uVar2 = ctx.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
              ._48_8_;
      ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str = (char *)0x3;
      ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _16_8_ = srcAnnotationKind;
      local_58 = DAT_010d2400;
      pIStack_50 = srcAnnotationKind;
      pcVar5 = (char *)ctx.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                       ._48_8_;
      uVar3 = ctx.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
              ._M_payload._40_1_;
      if ((ulong)ctx.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                 ._48_8_ < 3) goto LAB_00b8f98e;
      unaff_RBX = ctx_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_len + 3;
      pcVar5 = (char *)0xffffffffffffffff;
      local_48 = (char *)(ctx.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                          ._48_8_ - 3);
      in_RCX = DAT_010d2400;
      if (local_48 != (char *)0x0) {
        pvVar6 = memchr((void *)unaff_RBX,10,(size_t)local_48);
        in_RCX = (char *)((long)pvVar6 - unaff_RBX);
        pcVar5 = (char *)(-(ulong)(pvVar6 == (void *)0x0) | (ulong)in_RCX);
      }
      unaff_R14 = ctx_1.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                  _M_payload._M_value.span._M_str;
      ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _M_payload._M_value.span._M_str = (char *)uVar2;
      pcStack_40 = (char *)unaff_RBX;
      local_38 = local_48;
      if (pcVar5 != (char *)0xffffffffffffffff) {
        unaff_R14 = pcVar5 + 3;
        ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._M_value.span._M_str = (char *)unaff_R14;
        local_38 = pcVar5;
      }
LAB_00b8f852:
      if (ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._M_value.span._M_str != (char *)0x0) {
        unaff_RBX = ctx.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                    ._48_8_;
        unaff_R14 = ctx_1.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_payload._M_value.span._M_len;
        if (ctx_1.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
            _M_payload._M_value.span._M_str <=
            (ulong)ctx.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                   ._48_8_) {
          unaff_RBX = ctx_1.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._M_payload._M_value.span._M_str;
        }
      }
      if (ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._M_value.span._M_str == (char *)0x0) goto LAB_00b8f8cc;
      if ((ulong)ctx_1.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _16_8_ < pIStack_50) {
        pIStack_50 = (IString *)
                     ctx_1.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._16_8_;
      }
      s._M_str = (char *)0x0;
      s._M_len = (size_t)local_58;
      ctx.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
      _M_payload._8_16_ = (undefined1  [16])IString::interned(pIStack_50,s,SUB81(in_RCX,0));
      in_RCX = local_38;
      if (local_48 < local_38) {
        in_RCX = local_48;
      }
      ctx.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
      _M_payload._M_value.annotation.contents._M_len = (size_t)pcStack_40;
      ctx.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
      _M_payload._40_1_ = 1;
      local_b0 = (char *)unaff_RBX;
      ctx.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
      _M_payload._M_value.super_LexResult.span._M_len = unaff_R14;
      ctx.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>.
      _M_payload.
      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
      _M_payload._M_value.annotation.kind.super_IString.str._M_str = in_RCX;
    }
LAB_00b8f8d0:
    unaff_RBX = CONCAT71((int7)((ulong)unaff_RBX >> 8),
                         ctx.
                         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                         ._M_payload._40_1_);
    if (ctx.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>.
        _M_payload._40_1_ == '\x01') {
      this->pos = (size_t)(local_b0 + this->pos);
      __position._M_current =
           (this->annotations).
           super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->annotations).
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wasm::WATParser::Annotation,std::allocator<wasm::WATParser::Annotation>>::
        _M_realloc_insert<wasm::WATParser::Annotation_const&>
                  ((vector<wasm::WATParser::Annotation,std::allocator<wasm::WATParser::Annotation>>
                    *)&this->annotations,__position,
                   (Annotation *)
                   ((long)&ctx.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                           ._M_payload._M_value.super_LexResult.span + 8));
      }
      else {
        ((__position._M_current)->contents)._M_len =
             (size_t)ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                     ._M_payload._M_value.annotation.kind.super_IString.str._M_str;
        ((__position._M_current)->contents)._M_str =
             (char *)ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                     ._M_payload._M_value.annotation.contents._M_len;
        ((__position._M_current)->kind).super_IString.str._M_len =
             (size_t)ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                     ._M_payload._M_value.super_LexResult.span._M_str;
        ((__position._M_current)->kind).super_IString.str._M_str =
             (char *)ctx.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                     ._M_payload._M_value.annotation.kind.super_IString.str._M_len;
        ppAVar1 = &(this->annotations).
                   super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
    }
    else {
      sVar10 = next(this);
      anon_unknown_0::space
                ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                 &ctx.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                  ._M_engaged,sVar10);
      if (ctx_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ != '\x01') {
        return;
      }
      this->pos = this->pos +
                  ctx.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                  ._48_8_;
    }
  } while( true );
}

Assistant:

void Lexer::skipSpace() {
  while (true) {
    if (auto ctx = annotation(next())) {
      pos += ctx->span.size();
      annotations.push_back(ctx->annotation);
      continue;
    }
    if (auto ctx = space(next())) {
      pos += ctx->span.size();
      continue;
    }
    break;
  }
}